

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_nodes.cpp
# Opt level: O3

SerializedReadCSVData *
duckdb::SerializedReadCSVData::Deserialize
          (SerializedReadCSVData *__return_storage_ptr__,Deserializer *deserializer)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  vector<duckdb::ColumnInfo,_std::allocator<duckdb::ColumnInfo>_> local_68;
  vector<duckdb::ColumnInfo,_std::allocator<duckdb::ColumnInfo>_> local_48;
  idx_t iVar3;
  
  (__return_storage_ptr__->return_names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->return_names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->return_types).
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->return_types).
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->csv_names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->return_types).
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->csv_names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->csv_names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->csv_types).
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->csv_types).
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->files).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->csv_types).
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->files).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->files).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->return_names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  SerializedCSVReaderOptions::SerializedCSVReaderOptions(&__return_storage_ptr__->options);
  (__return_storage_ptr__->reader_bind).filename_idx.index = 0xffffffffffffffff;
  (__return_storage_ptr__->reader_bind).hive_partitioning_indexes.
  super_vector<duckdb::HivePartitioningIndex,_std::allocator<duckdb::HivePartitioningIndex>_>.
  super__Vector_base<duckdb::HivePartitioningIndex,_std::allocator<duckdb::HivePartitioningIndex>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->reader_bind).hive_partitioning_indexes.
  super_vector<duckdb::HivePartitioningIndex,_std::allocator<duckdb::HivePartitioningIndex>_>.
  super__Vector_base<duckdb::HivePartitioningIndex,_std::allocator<duckdb::HivePartitioningIndex>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->reader_bind).hive_partitioning_indexes.
  super_vector<duckdb::HivePartitioningIndex,_std::allocator<duckdb::HivePartitioningIndex>_>.
  super__Vector_base<duckdb::HivePartitioningIndex,_std::allocator<duckdb::HivePartitioningIndex>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->reader_bind).schema.
  super_vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
  .
  super__Vector_base<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->reader_bind).schema.
  super_vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
  .
  super__Vector_base<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->reader_bind).schema.
  super_vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
  .
  super__Vector_base<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->reader_bind).mapping = BY_NAME;
  (__return_storage_ptr__->column_info).
  super_vector<duckdb::ColumnInfo,_std::allocator<duckdb::ColumnInfo>_>.
  super__Vector_base<duckdb::ColumnInfo,_std::allocator<duckdb::ColumnInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->column_info).
  super_vector<duckdb::ColumnInfo,_std::allocator<duckdb::ColumnInfo>_>.
  super__Vector_base<duckdb::ColumnInfo,_std::allocator<duckdb::ColumnInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->column_info).
  super_vector<duckdb::ColumnInfo,_std::allocator<duckdb::ColumnInfo>_>.
  super__Vector_base<duckdb::ColumnInfo,_std::allocator<duckdb::ColumnInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Deserializer::ReadPropertyWithDefault<duckdb::vector<std::__cxx11::string,true>>
            (deserializer,100,"files",&__return_storage_ptr__->files);
  Deserializer::ReadPropertyWithDefault<duckdb::vector<duckdb::LogicalType,true>>
            (deserializer,0x65,"csv_types",&__return_storage_ptr__->csv_types);
  Deserializer::ReadPropertyWithDefault<duckdb::vector<std::__cxx11::string,true>>
            (deserializer,0x66,"csv_names",&__return_storage_ptr__->csv_names);
  Deserializer::ReadPropertyWithDefault<duckdb::vector<duckdb::LogicalType,true>>
            (deserializer,0x67,"return_types",&__return_storage_ptr__->return_types);
  Deserializer::ReadPropertyWithDefault<duckdb::vector<std::__cxx11::string,true>>
            (deserializer,0x68,"return_names",&__return_storage_ptr__->return_names);
  uVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x69,"filename_col_idx");
  if ((char)uVar1 == '\0') {
    iVar3 = 0;
  }
  else {
    iVar2 = (*deserializer->_vptr_Deserializer[0x15])(deserializer);
    iVar3 = CONCAT44(extraout_var,iVar2);
  }
  __return_storage_ptr__->filename_col_idx = iVar3;
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar1 & 0xff));
  Deserializer::ReadProperty<duckdb::SerializedCSVReaderOptions>
            (deserializer,0x6a,"options",&__return_storage_ptr__->options);
  Deserializer::ReadProperty<duckdb::MultiFileReaderBindData>
            (deserializer,0x6b,"reader_bind",&__return_storage_ptr__->reader_bind);
  uVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x6c,"column_info");
  if ((char)uVar1 == '\0') {
    local_48.super__Vector_base<duckdb::ColumnInfo,_std::allocator<duckdb::ColumnInfo>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (__return_storage_ptr__->column_info).
         super_vector<duckdb::ColumnInfo,_std::allocator<duckdb::ColumnInfo>_>.
         super__Vector_base<duckdb::ColumnInfo,_std::allocator<duckdb::ColumnInfo>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_48.super__Vector_base<duckdb::ColumnInfo,_std::allocator<duckdb::ColumnInfo>_>._M_impl.
    super__Vector_impl_data._M_start =
         (__return_storage_ptr__->column_info).
         super_vector<duckdb::ColumnInfo,_std::allocator<duckdb::ColumnInfo>_>.
         super__Vector_base<duckdb::ColumnInfo,_std::allocator<duckdb::ColumnInfo>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_48.super__Vector_base<duckdb::ColumnInfo,_std::allocator<duckdb::ColumnInfo>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (__return_storage_ptr__->column_info).
         super_vector<duckdb::ColumnInfo,_std::allocator<duckdb::ColumnInfo>_>.
         super__Vector_base<duckdb::ColumnInfo,_std::allocator<duckdb::ColumnInfo>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->column_info).
    super_vector<duckdb::ColumnInfo,_std::allocator<duckdb::ColumnInfo>_>.
    super__Vector_base<duckdb::ColumnInfo,_std::allocator<duckdb::ColumnInfo>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->column_info).
    super_vector<duckdb::ColumnInfo,_std::allocator<duckdb::ColumnInfo>_>.
    super__Vector_base<duckdb::ColumnInfo,_std::allocator<duckdb::ColumnInfo>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->column_info).
    super_vector<duckdb::ColumnInfo,_std::allocator<duckdb::ColumnInfo>_>.
    super__Vector_base<duckdb::ColumnInfo,_std::allocator<duckdb::ColumnInfo>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
  }
  else {
    Deserializer::Read<duckdb::vector<duckdb::ColumnInfo,true>>((type *)&local_68,deserializer);
    local_48.super__Vector_base<duckdb::ColumnInfo,_std::allocator<duckdb::ColumnInfo>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (__return_storage_ptr__->column_info).
         super_vector<duckdb::ColumnInfo,_std::allocator<duckdb::ColumnInfo>_>.
         super__Vector_base<duckdb::ColumnInfo,_std::allocator<duckdb::ColumnInfo>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    (__return_storage_ptr__->column_info).
    super_vector<duckdb::ColumnInfo,_std::allocator<duckdb::ColumnInfo>_>.
    super__Vector_base<duckdb::ColumnInfo,_std::allocator<duckdb::ColumnInfo>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_68.super__Vector_base<duckdb::ColumnInfo,_std::allocator<duckdb::ColumnInfo>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_48.super__Vector_base<duckdb::ColumnInfo,_std::allocator<duckdb::ColumnInfo>_>._M_impl.
    super__Vector_impl_data._M_start =
         (__return_storage_ptr__->column_info).
         super_vector<duckdb::ColumnInfo,_std::allocator<duckdb::ColumnInfo>_>.
         super__Vector_base<duckdb::ColumnInfo,_std::allocator<duckdb::ColumnInfo>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_48.super__Vector_base<duckdb::ColumnInfo,_std::allocator<duckdb::ColumnInfo>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (__return_storage_ptr__->column_info).
         super_vector<duckdb::ColumnInfo,_std::allocator<duckdb::ColumnInfo>_>.
         super__Vector_base<duckdb::ColumnInfo,_std::allocator<duckdb::ColumnInfo>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->column_info).
    super_vector<duckdb::ColumnInfo,_std::allocator<duckdb::ColumnInfo>_>.
    super__Vector_base<duckdb::ColumnInfo,_std::allocator<duckdb::ColumnInfo>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_68.super__Vector_base<duckdb::ColumnInfo,_std::allocator<duckdb::ColumnInfo>_>.
         _M_impl.super__Vector_impl_data._M_start;
    (__return_storage_ptr__->column_info).
    super_vector<duckdb::ColumnInfo,_std::allocator<duckdb::ColumnInfo>_>.
    super__Vector_base<duckdb::ColumnInfo,_std::allocator<duckdb::ColumnInfo>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_68.super__Vector_base<duckdb::ColumnInfo,_std::allocator<duckdb::ColumnInfo>_>.
         _M_impl.super__Vector_impl_data._M_finish;
  }
  local_68.super__Vector_base<duckdb::ColumnInfo,_std::allocator<duckdb::ColumnInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.super__Vector_base<duckdb::ColumnInfo,_std::allocator<duckdb::ColumnInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.super__Vector_base<duckdb::ColumnInfo,_std::allocator<duckdb::ColumnInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ::std::vector<duckdb::ColumnInfo,_std::allocator<duckdb::ColumnInfo>_>::~vector(&local_48);
  ::std::vector<duckdb::ColumnInfo,_std::allocator<duckdb::ColumnInfo>_>::~vector(&local_68);
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar1 & 0xff));
  return __return_storage_ptr__;
}

Assistant:

SerializedReadCSVData SerializedReadCSVData::Deserialize(Deserializer &deserializer) {
	SerializedReadCSVData result;
	deserializer.ReadPropertyWithDefault<vector<string>>(100, "files", result.files);
	deserializer.ReadPropertyWithDefault<vector<LogicalType>>(101, "csv_types", result.csv_types);
	deserializer.ReadPropertyWithDefault<vector<string>>(102, "csv_names", result.csv_names);
	deserializer.ReadPropertyWithDefault<vector<LogicalType>>(103, "return_types", result.return_types);
	deserializer.ReadPropertyWithDefault<vector<string>>(104, "return_names", result.return_names);
	deserializer.ReadPropertyWithDefault<idx_t>(105, "filename_col_idx", result.filename_col_idx);
	deserializer.ReadProperty<SerializedCSVReaderOptions>(106, "options", result.options);
	deserializer.ReadProperty<MultiFileReaderBindData>(107, "reader_bind", result.reader_bind);
	deserializer.ReadPropertyWithDefault<vector<ColumnInfo>>(108, "column_info", result.column_info);
	return result;
}